

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderSAH<8,_embree::InstanceArrayPrimitive>::build
          (BVHNBuilderSAH<8,_embree::InstanceArrayPrimitive> *this)

{
  BVH **ppBVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer ppTVar5;
  PrimRef *pPVar6;
  MemoryMonitorInterface *pMVar7;
  Geometry *pGVar8;
  Scene *pSVar9;
  GTypeMask GVar10;
  double dVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  PrimRef *pPVar17;
  NodeRef root;
  uint uVar18;
  size_t i;
  ulong uVar19;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  pointer ppTVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  BVH *pBVar24;
  size_t sVar25;
  double t0;
  undefined1 auVar26 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  PrimInfo pinfo;
  string local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar24 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar24->alloc);
    ppTVar5 = (pBVar24->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar20 = (pBVar24->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar20 != ppTVar5;
        ppTVar20 = ppTVar20 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar20,&pBVar24->alloc);
    }
    ppTVar20 = (pBVar24->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar24->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar20) {
      (pBVar24->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar20;
    }
    LOCK();
    (pBVar24->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar24->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar24->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar24->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar24->alloc).usedBlocks._M_b._M_p,(pBVar24->alloc).device,
                 (pBVar24->alloc).useUSM);
    }
    LOCK();
    (pBVar24->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar24->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar24->alloc).freeBlocks._M_b._M_p,(pBVar24->alloc).device,
                 (pBVar24->alloc).useUSM);
    }
    LOCK();
    (pBVar24->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    for (lVar16 = -0x40; lVar16 != 0; lVar16 = lVar16 + 8) {
      LOCK();
      *(undefined8 *)((long)&(pBVar24->alloc).threadBlocks[0]._M_b._M_p + lVar16) = 0;
      UNLOCK();
      LOCK();
      *(undefined8 *)((long)&(pBVar24->alloc).threadBlocks[8]._M_b._M_p + lVar16) = 0;
      UNLOCK();
    }
    sVar23 = (pBVar24->alloc).primrefarray.size_alloced;
    pPVar6 = (pBVar24->alloc).primrefarray.items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar23 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar23 << 5,(pBVar24->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar23 != 0) {
      pMVar7 = (pBVar24->alloc).primrefarray.alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar23 * -0x20,1);
    }
    (pBVar24->alloc).primrefarray.size_active = 0;
    (pBVar24->alloc).primrefarray.size_alloced = 0;
    (pBVar24->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar8 = this->mesh;
  if (pGVar8 == (Geometry *)0x0) {
    pSVar9 = this->scene;
    GVar10 = this->gtype_;
    uVar18 = (uint)GVar10;
    if ((uVar18 >> 0x14 & 1) == 0) {
      sVar23 = 0;
    }
    else {
      sVar23 = (pSVar9->world).numTriangles;
    }
    if ((uVar18 >> 0x15 & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numQuads;
    }
    if ((GVar10 & MTY_CURVE2) != ~MTY_ALL) {
      sVar23 = sVar23 + (pSVar9->world).numLineSegments;
    }
    if ((GVar10 & MTY_CURVE4) != ~MTY_ALL) {
      sVar23 = sVar23 + (pSVar9->world).numBezierCurves;
    }
    if ((GVar10 & MTY_POINTS) != ~MTY_ALL) {
      sVar23 = sVar23 + (pSVar9->world).numPoints;
    }
    if ((uVar18 >> 0x17 & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numSubdivPatches;
    }
    if ((uVar18 >> 0x1d & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numUserGeometries;
    }
    if ((uVar18 >> 0x1e & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numInstancesCheap;
    }
    if ((int)uVar18 < 0) {
      sVar23 = sVar23 + (pSVar9->world).numInstancesExpensive;
    }
    if ((uVar18 >> 0x18 & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numInstanceArrays;
    }
    if ((uVar18 >> 0x16 & 1) != 0) {
      sVar23 = sVar23 + (pSVar9->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar23;
    if (sVar23 == 0) goto LAB_00c5529e;
    pBVar24 = this->bvh;
    std::__cxx11::to_string(&local_98,8);
    std::operator+(&local_108,"avx::BVH",&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_108,"BuilderSAH");
  }
  else {
    sVar23 = (size_t)pGVar8->numPrimitives;
    this->numPreviousPrimitives = pGVar8->numPrimitives;
    if (sVar23 == 0) {
LAB_00c5529e:
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar23 = (this->prims).size_alloced;
      pPVar6 = (this->prims).items;
      if (pPVar6 != (PrimRef *)0x0) {
        if (sVar23 << 5 < 0x1c00000) {
          alignedFree(pPVar6);
        }
        else {
          os_free(pPVar6,sVar23 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar23 != 0) {
        pMVar7 = (this->prims).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar23 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      return;
    }
    pBVar24 = this->bvh;
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_108);
  }
  ppBVar1 = &this->bvh;
  t0 = BVHN<8>::preBuild(pBVar24,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (pGVar8 == (Geometry *)0x0) {
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (this->primrefarrayalloc == true) {
    uVar19 = 0xffffffffffffffff;
    if (999999 < sVar23) {
      uVar19 = sVar23 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar19;
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar1)->alloc).atype = EMBREE_OS_MALLOC;
  }
  auVar26._8_8_ = 0;
  auVar26._0_8_ = sVar23;
  auVar26 = vpunpckldq_avx(auVar26,_DAT_01f46b10);
  auVar26 = vsubpd_avx(auVar26,_DAT_01f46b20);
  dVar11 = (auVar26._0_8_ + auVar26._8_8_) * 1.2 * 8.0;
  uVar19 = (ulong)dVar11;
  sVar25 = ((long)(dVar11 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) +
           (sVar23 * 0x1c0 >> 5);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar25);
  sVar25 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,8,0x400,sVar23,sVar25);
  (this->settings).singleThreadThreshold = sVar25;
  uVar19 = (this->prims).size_alloced;
  uVar22 = uVar19;
  if ((uVar19 < sVar23) && (uVar21 = uVar19, uVar22 = sVar23, uVar19 != 0)) {
    for (; uVar22 = uVar21, uVar21 < sVar23; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  psVar2 = &(this->prims).size_active;
  if (sVar23 < (this->prims).size_active) {
    *psVar2 = sVar23;
  }
  prims = (EVP_PKEY_CTX *)&this->prims;
  if (uVar19 == uVar22) {
    *psVar2 = sVar23;
  }
  else {
    pMVar7 = (this->prims).alloc.device;
    pPVar6 = (this->prims).items;
    uVar19 = uVar22 << 5;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar19,0);
    if (uVar19 < 0x1c00000) {
      pPVar17 = (PrimRef *)alignedMalloc(uVar19,0x20);
    }
    else {
      pPVar17 = (PrimRef *)os_malloc(uVar19,&(this->prims).alloc.hugepages);
    }
    (this->prims).items = pPVar17;
    lVar16 = 0;
    for (uVar19 = 0; uVar19 < *psVar2; uVar19 = uVar19 + 1) {
      puVar3 = (undefined8 *)((long)&(pPVar6->lower).field_0 + lVar16);
      uVar13 = puVar3[1];
      uVar14 = puVar3[2];
      uVar15 = puVar3[3];
      puVar4 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar16);
      *puVar4 = *puVar3;
      puVar4[1] = uVar13;
      puVar4[2] = uVar14;
      puVar4[3] = uVar15;
      lVar16 = lVar16 + 0x20;
    }
    sVar25 = (this->prims).size_alloced;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar25 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar25 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar25 != 0) {
      pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar25 * -0x20,1);
    }
    (this->prims).size_active = sVar23;
    (this->prims).size_alloced = uVar22;
  }
  if (this->mesh == (Geometry *)0x0) {
    avx::createPrimRefArray
              (&pinfo,this->scene,this->gtype_,false,sVar23,(mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    avx::createPrimRefArray
              (&pinfo,this->mesh,this->geomID_,sVar23,(mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  local_78._8_8_ = this->bvh;
  if (pinfo.end == pinfo.begin) {
    (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
    sVar23 = (this->prims).size_alloced;
    pPVar6 = (this->prims).items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar23 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar23 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar23 != 0) {
      pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar23 * -0x20,1);
    }
    *psVar2 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    local_78._0_8_ = &PTR_createLeaf_021e6900;
    root = BVHNBuilderVirtual<8>::BVHNBuilderV::build
                     ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                      &(((BVH *)local_78._8_8_)->scene->progressInterface).
                       super_BuildProgressMonitor,(this->prims).items,&pinfo,this->settings);
    local_78._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_78._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_68._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    local_68._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_58._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_58._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_48._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    local_48._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    BVHN<8>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,pinfo.end - pinfo.begin);
    fVar12 = (float)(pinfo.end - pinfo.begin) * 0.005;
    uVar19 = (ulong)fVar12;
    ctx = (EVP_PKEY_CTX *)((long)(fVar12 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
    BVHN<8>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
      if ((this->scene != (Scene *)0x0) &&
         ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
        sVar23 = (this->prims).size_alloced;
        pPVar6 = (this->prims).items;
        if (pPVar6 != (PrimRef *)0x0) {
          ctx = (EVP_PKEY_CTX *)(sVar23 << 5);
          if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
            alignedFree(pPVar6);
          }
          else {
            os_free(pPVar6,(size_t)ctx,(this->prims).alloc.hugepages);
          }
        }
        if (sVar23 != 0) {
          pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
          ctx = (EVP_PKEY_CTX *)(sVar23 * -0x20);
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,ctx,1);
        }
        *psVar2 = 0;
        (this->prims).size_alloced = 0;
        (this->prims).items = (PrimRef *)0x0;
      }
    }
    else {
      FastAllocator::share(&(*ppBVar1)->alloc,(mvector<PrimRef> *)prims);
      ctx = prims;
    }
    BVHN<8>::cleanup(*ppBVar1,ctx);
    BVHN<8>::postBuild(*ppBVar1,t0);
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }